

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O3

u32 __thiscall
moira::Moira::computeEAbrief<(moira::Core)2,(moira::Mode)10,1,128ull>(Moira *this,u32 an)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  u32 uVar4;
  
  uVar1 = (this->queue).irc;
  iVar2 = *(int *)((long)&(this->reg).field_3 + (ulong)(uVar1 >> 0xc) * 4);
  iVar3 = (int)(short)iVar2;
  if ((uVar1 >> 0xb & 1) != 0) {
    iVar3 = iVar2;
  }
  uVar4 = (this->reg).pc + 2;
  (this->reg).pc = uVar4;
  uVar4 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar4);
  (this->queue).irc = (u16)uVar4;
  return (int)(char)uVar1 + an + (iVar3 << ((byte)(uVar1 >> 9) & 3));
}

Assistant:

u32
Moira::computeEAbrief(u32 an)
{
    u32 result;

    //   15 - 12    11   10   09   08   07   06   05   04   03   02   01   00
    // -----------------------------------------------------------------------
    // | REGISTER | LW | SCALE   | 0  | DISPLACEMENT                         |
    // -----------------------------------------------------------------------

    u16 ext   = queue.irc;
    u16 rn    = xxxx____________ (ext);
    u16 lw    = ____x___________ (ext);
    u16 scale = _____xx_________ (ext);
    u16 disp  = ________xxxxxxxx (ext);

    u32 xn = u32(u64(lw ? readR(rn) : SEXT<Word>(readR(rn))) << scale);
    result = U32_ADD3(an, i8(disp), xn);

    SYNC(2);
    if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }

    return result;
}